

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

void optimize_palette_colors
               (uint16_t *color_cache,int n_cache,int n_colors,int stride,int16_t *centroids,
               int bit_depth)

{
  int iVar1;
  int min_threshold;
  int this_diff;
  int j;
  int idx;
  int min_diff;
  int i;
  int bit_depth_local;
  int16_t *centroids_local;
  int stride_local;
  int n_colors_local;
  int n_cache_local;
  uint16_t *color_cache_local;
  
  if (0 < n_cache) {
    for (i = 0; i < n_colors * stride; i = stride + i) {
      min_diff = (int)centroids[i] - (uint)*color_cache;
      if (min_diff < 1) {
        min_diff = -min_diff;
      }
      idx = 0;
      for (j = 1; j < n_cache; j = j + 1) {
        iVar1 = (int)centroids[i] - (uint)color_cache[j];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (iVar1 < min_diff) {
          idx = j;
          min_diff = iVar1;
        }
      }
      if (min_diff <= 4 << ((char)bit_depth - 8U & 0x1f)) {
        centroids[i] = color_cache[idx];
      }
    }
  }
  return;
}

Assistant:

static inline void optimize_palette_colors(uint16_t *color_cache, int n_cache,
                                           int n_colors, int stride,
                                           int16_t *centroids, int bit_depth) {
  if (n_cache <= 0) return;
  for (int i = 0; i < n_colors * stride; i += stride) {
    int min_diff = abs((int)centroids[i] - (int)color_cache[0]);
    int idx = 0;
    for (int j = 1; j < n_cache; ++j) {
      const int this_diff = abs((int)centroids[i] - (int)color_cache[j]);
      if (this_diff < min_diff) {
        min_diff = this_diff;
        idx = j;
      }
    }
    const int min_threshold = 4 << (bit_depth - 8);
    if (min_diff <= min_threshold) centroids[i] = color_cache[idx];
  }
}